

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::CallNative(SQVM *this,SQNativeClosure *nclosure,SQInteger nargs,SQInteger newbase,
                SQObjectPtr *retval,SQInt32 target,bool *suspend,bool *tailcall)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType SVar3;
  uint uVar4;
  uint uVar5;
  SQObjectType SVar6;
  CallInfo *pCVar7;
  SQTable *pSVar8;
  SQObjectPtr *pSVar9;
  long *plVar10;
  long lVar11;
  SQWeakRef *pSVar12;
  SQTable *pSVar13;
  bool bVar14;
  SQInteger SVar15;
  long lVar16;
  char *s;
  SQUnsignedInteger nparam;
  SQObjectPtr *pSVar17;
  long lVar18;
  SQUnsignedInteger SVar19;
  
  if (99 < this->_nnativecalls) {
    s = "Native stack overflow";
LAB_0013218e:
    Raise_Error(this,s);
    return false;
  }
  lVar16 = nclosure->_nparamscheck;
  if ((lVar16 != 0) &&
     ((0 < lVar16 && lVar16 != nargs || ((-nargs != lVar16 && nargs <= -lVar16) && lVar16 < 0)))) {
    s = "wrong number of parameters";
    goto LAB_0013218e;
  }
  SVar19 = (nclosure->_typecheck)._size;
  if (SVar19 != 0) {
    if (nargs < (long)SVar19) {
      SVar19 = nargs;
    }
    if (0 < (long)SVar19) {
      pSVar17 = (this->_stack)._vals + newbase;
      nparam = 0;
      do {
        lVar16 = (nclosure->_typecheck)._vals[nparam];
        if ((lVar16 != -1) &&
           (SVar3 = (pSVar17->super_SQObject)._type, ((SQObjectType)lVar16 & SVar3) == 0)) {
          Raise_ParamTypeError(this,nparam,lVar16,(ulong)SVar3);
          return false;
        }
        nparam = nparam + 1;
        pSVar17 = pSVar17 + 1;
      } while (SVar19 != nparam);
    }
  }
  bVar14 = EnterFrame(this,newbase,nargs + newbase + nclosure->_noutervalues,false);
  if (!bVar14) {
    return false;
  }
  pCVar7 = this->ci;
  pSVar8 = (pCVar7->_closure).super_SQObject._unVal.pTable;
  SVar3 = (pCVar7->_closure).super_SQObject._type;
  (pCVar7->_closure).super_SQObject._type = OT_NATIVECLOSURE;
  (pCVar7->_closure).super_SQObject._unVal.pNativeClosure = nclosure;
  pSVar1 = &(nclosure->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->ci->_target = target;
  SVar19 = nclosure->_noutervalues;
  if (0 < (long)SVar19) {
    lVar18 = nargs * 0x10 + newbase * 0x10;
    lVar16 = 8;
    do {
      pSVar17 = nclosure->_outervalues;
      pSVar9 = (this->_stack)._vals;
      uVar4 = *(uint *)((long)pSVar9 + lVar16 + -8 + lVar18);
      plVar10 = *(long **)((long)&pSVar9[newbase + nargs].super_SQObject._type + lVar16);
      lVar11 = *(long *)((long)&(pSVar17->super_SQObject)._type + lVar16);
      *(long *)((long)&pSVar9[newbase + nargs].super_SQObject._type + lVar16) = lVar11;
      uVar5 = *(uint *)((long)pSVar17 + lVar16 + -8);
      *(uint *)((long)pSVar9 + lVar16 + -8 + lVar18) = uVar5;
      if ((uVar5 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(lVar11 + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar2 = plVar10 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar10 + 0x10))();
        }
      }
      lVar16 = lVar16 + 0x10;
      SVar19 = SVar19 - 1;
    } while (SVar19 != 0);
  }
  pSVar12 = nclosure->_env;
  if (pSVar12 != (SQWeakRef *)0x0) {
    pSVar17 = (this->_stack)._vals;
    SVar3 = pSVar17[newbase].super_SQObject._type;
    pSVar8 = pSVar17[newbase].super_SQObject._unVal.pTable;
    pSVar13 = (pSVar12->_obj)._unVal.pTable;
    pSVar17[newbase].super_SQObject._unVal.pTable = pSVar13;
    SVar6 = (pSVar12->_obj)._type;
    pSVar17[newbase].super_SQObject._type = SVar6;
    if ((SVar6 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  this->_nnativecalls = this->_nnativecalls + 1;
  SVar15 = (*nclosure->_function)(this);
  this->_nnativecalls = this->_nnativecalls + -1;
  *suspend = false;
  *tailcall = false;
  if (SVar15 == -0x29a) {
    *suspend = true;
  }
  else {
    if (SVar15 == -0x309) {
      *tailcall = true;
      return true;
    }
    if (SVar15 < 0) {
      LeaveFrame(this);
      Raise_Error(this,&this->_lasterror);
      return false;
    }
    if (SVar15 == 0) {
      pSVar13 = (retval->super_SQObject)._unVal.pTable;
      SVar6 = (retval->super_SQObject)._type;
      (retval->super_SQObject)._type = OT_NULL;
      (retval->super_SQObject)._unVal.pTable = (SQTable *)0x0;
      goto joined_r0x001323ca;
    }
  }
  pSVar17 = (this->_stack)._vals;
  lVar16 = this->_top;
  SVar6 = (retval->super_SQObject)._type;
  pSVar13 = (retval->super_SQObject)._unVal.pTable;
  pSVar8 = pSVar17[lVar16 + -1].super_SQObject._unVal.pTable;
  (retval->super_SQObject)._unVal.pTable = pSVar8;
  SVar3 = pSVar17[lVar16 + -1].super_SQObject._type;
  (retval->super_SQObject)._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
joined_r0x001323ca:
  if ((SVar6 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])()
      ;
    }
  }
  LeaveFrame(this);
  return true;
}

Assistant:

bool SQVM::CallNative(SQNativeClosure *nclosure, SQInteger nargs, SQInteger newbase, SQObjectPtr &retval, SQInt32 target,bool &suspend, bool &tailcall)
{
    SQInteger nparamscheck = nclosure->_nparamscheck;
    SQInteger newtop = newbase + nargs + nclosure->_noutervalues;

    if (_nnativecalls + 1 > MAX_NATIVE_CALLS) {
        Raise_Error(_SC("Native stack overflow"));
        return false;
    }

    if(nparamscheck && (((nparamscheck > 0) && (nparamscheck != nargs)) ||
        ((nparamscheck < 0) && (nargs < (-nparamscheck)))))
    {
        Raise_Error(_SC("wrong number of parameters"));
        return false;
    }

    SQInteger tcs;
    SQIntVec &tc = nclosure->_typecheck;
    if((tcs = tc.size())) {
        for(SQInteger i = 0; i < nargs && i < tcs; i++) {
            if((tc._vals[i] != -1) && !(sq_type(_stack._vals[newbase+i]) & tc._vals[i])) {
                Raise_ParamTypeError(i,tc._vals[i], sq_type(_stack._vals[newbase+i]));
                return false;
            }
        }
    }

    if(!EnterFrame(newbase, newtop, false)) return false;
    ci->_closure  = nclosure;
	ci->_target = target;

    SQInteger outers = nclosure->_noutervalues;
    for (SQInteger i = 0; i < outers; i++) {
        _stack._vals[newbase+nargs+i] = nclosure->_outervalues[i];
    }
    if(nclosure->_env) {
        _stack._vals[newbase] = nclosure->_env->_obj;
    }

    _nnativecalls++;
    SQInteger ret = (nclosure->_function)(this);
    _nnativecalls--;

    suspend = false;
	tailcall = false;
	if (ret == SQ_TAILCALL_FLAG) {
		tailcall = true;
		return true;
	}
    else if (ret == SQ_SUSPEND_FLAG) {
        suspend = true;
    }
    else if (ret < 0) {
        LeaveFrame();
        Raise_Error(_lasterror);
        return false;
    }
    if(ret) {
        retval = _stack._vals[_top-1];
    }
    else {
        retval.Null();
    }
    //retval = ret ? _stack._vals[_top-1] : _null_;
    LeaveFrame();
    return true;
}